

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::qstring_trait_t>::parse
          (parser_conffile_impl_t<cfgfile::qstring_trait_t> *this,string_t *file_name)

{
  tag_t<cfgfile::qstring_trait_t> *ptVar1;
  tag_t<cfgfile::qstring_trait_t> **pptVar2;
  bool bVar3;
  int iVar4;
  _Elt_pointer pptVar5;
  undefined4 extraout_var;
  exception_t<cfgfile::qstring_trait_t> *this_00;
  _Elt_pointer pptVar6;
  allocator<char> local_23d;
  allocator<char> local_23c;
  allocator<char> local_23b;
  allocator<char> local_23a;
  allocator<char> local_239;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined4 uStack_218;
  undefined4 uStack_214;
  stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
  *local_210;
  lexeme_t<cfgfile::qstring_trait_t> lexeme;
  string_t local_1e8;
  string_t local_1d0;
  string_t local_1b8;
  string_t local_1a0;
  string_t local_188;
  string_t local_170;
  qstring_wrapper_t local_158;
  qstring_wrapper_t local_140;
  qstring_wrapper_t local_128;
  qstring_wrapper_t local_110;
  qstring_wrapper_t local_f8;
  qstring_wrapper_t local_e0;
  qstring_wrapper_t local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar3 = start_first_tag_parsing(this);
  if (bVar3) {
    lexical_analyzer_t<cfgfile::qstring_trait_t>::next_lexeme(&lexeme,&this->m_lex);
    local_210 = &(this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack;
    while( true ) {
      if (lexeme.m_type == null) break;
      pptVar5 = (this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c.
                super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pptVar5 ==
          (this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c.
          super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        this_00 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_238,
                   "Unexpected content. We\'ve finished parsing, but we\'ve got this: \"",&local_239
                  );
        qstring_trait_t::from_ascii(&local_170,(string *)local_238);
        operator+(&local_158,&local_170,&lexeme.m_value);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"\". ",&local_23a);
        qstring_trait_t::from_ascii(&local_188,&local_50);
        operator+(&local_140,&local_158,&local_188);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"In file \"",&local_23b);
        qstring_trait_t::from_ascii(&local_1a0,&local_70);
        operator+(&local_128,&local_140,&local_1a0);
        operator+(&local_110,&local_128,file_name);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"\" on line ",&local_23c);
        qstring_trait_t::from_ascii(&local_1b8,&local_90);
        operator+(&local_f8,&local_110,&local_1b8);
        qstring_trait_t::to_string(&local_1d0,(this->m_lex).m_line_number);
        operator+(&local_e0,&local_f8,&local_1d0);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,".",&local_23d);
        qstring_trait_t::from_ascii(&local_1e8,&local_b0);
        operator+(&local_c8,&local_e0,&local_1e8);
        exception_t<cfgfile::qstring_trait_t>::exception_t(this_00,&local_c8);
        __cxa_throw(this_00,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                    exception_t<cfgfile::qstring_trait_t>::~exception_t);
      }
      if (lexeme.m_type == start) {
        if (pptVar5 ==
            (this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c.
            super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pptVar2 = (this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c.
                    super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          pptVar6 = pptVar2 + 0x3f;
          pptVar5 = pptVar2 + 0x40;
        }
        else {
          pptVar6 = pptVar5 + -1;
        }
        ptVar1 = *pptVar6;
        iVar4 = (*pptVar5[-1]->_vptr_tag_t[2])();
        start_tag_parsing(this,ptVar1,(child_tags_list_t *)CONCAT44(extraout_var,iVar4));
      }
      else if (lexeme.m_type == finish) {
        if (pptVar5 ==
            (this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c.
            super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pptVar5 = (this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c.
                    super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        ptVar1 = pptVar5[-1];
        local_228._8_4_ = (undefined4)(this->m_lex).m_line_number;
        local_228._12_4_ = *(undefined4 *)((long)&(this->m_lex).m_line_number + 4);
        uStack_218 = (undefined4)(this->m_lex).m_column_number;
        uStack_214 = *(undefined4 *)((long)&(this->m_lex).m_column_number + 4);
        local_238._0_8_ = (file_name->m_str).d.d;
        local_238._8_8_ = (file_name->m_str).d.ptr;
        local_228._M_allocated_capacity = (file_name->m_str).d.size;
        if ((Data *)local_238._0_8_ != (Data *)0x0) {
          LOCK();
          (((Data *)local_238._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)
                (((Data *)local_238._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>
               + 1);
          UNLOCK();
        }
        (*ptVar1->_vptr_tag_t[6])(ptVar1,(lexeme_t<cfgfile::qstring_trait_t> *)local_238);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_238);
        std::
        deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
        ::pop_back(&local_210->c);
      }
      else if (lexeme.m_type == string) {
        if (pptVar5 ==
            (this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c.
            super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pptVar5 = (this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c.
                    super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        ptVar1 = pptVar5[-1];
        local_228._8_4_ = (undefined4)(this->m_lex).m_line_number;
        local_228._12_4_ = *(undefined4 *)((long)&(this->m_lex).m_line_number + 4);
        uStack_218 = (undefined4)(this->m_lex).m_column_number;
        uStack_214 = *(undefined4 *)((long)&(this->m_lex).m_column_number + 4);
        local_238._0_8_ = (file_name->m_str).d.d;
        local_238._8_8_ = (file_name->m_str).d.ptr;
        local_228._M_allocated_capacity = (file_name->m_str).d.size;
        if ((Data *)local_238._0_8_ != (Data *)0x0) {
          LOCK();
          (((Data *)local_238._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)
                (((Data *)local_238._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>
               + 1);
          UNLOCK();
        }
        (*ptVar1->_vptr_tag_t[7])
                  (ptVar1,(lexeme_t<cfgfile::qstring_trait_t> *)local_238,&lexeme.m_value);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_238);
      }
      lexical_analyzer_t<cfgfile::qstring_trait_t>::next_lexeme
                ((lexeme_t<cfgfile::qstring_trait_t> *)local_238,&this->m_lex);
      lexeme_t<cfgfile::qstring_trait_t>::operator=
                (&lexeme,(lexeme_t<cfgfile::qstring_trait_t> *)local_238);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)(local_238 + 8));
    }
    parser_base_t<cfgfile::qstring_trait_t>::check_parser_state_after_parsing
              (&this->super_parser_base_t<cfgfile::qstring_trait_t>);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&lexeme.m_value);
  }
  return;
}

Assistant:

void parse( const typename Trait::string_t & file_name ) override
	{
		if( !start_first_tag_parsing() )
			return;

		lexeme_t< Trait > lexeme = m_lex.next_lexeme();

		while( !lexeme.is_null() )
		{
			if( !this->m_stack.empty() )
			{
				switch( lexeme.type() )
				{
					case lexeme_type_t::start :
						start_tag_parsing( *this->m_stack.top(),
							this->m_stack.top()->children() );
						break;

					case lexeme_type_t::string :
						this->m_stack.top()->on_string( parser_info_t< Trait >(
								file_name,
								m_lex.line_number(),
								m_lex.column_number() ),
							lexeme.value() );
						break;

					case lexeme_type_t::finish :
					{
						this->m_stack.top()->on_finish( parser_info_t< Trait >(
							file_name,
							m_lex.line_number(),
							m_lex.column_number() ) );
						this->m_stack.pop();
					}
						break;

					default:
						break;
				}
			}
			else
				throw exception_t< Trait >(
					Trait::from_ascii( "Unexpected content. "
						"We've finished parsing, but we've got this: \"" ) +
					lexeme.value() + Trait::from_ascii( "\". " ) +
					Trait::from_ascii( "In file \"" ) + file_name +
					Trait::from_ascii( "\" on line " ) +
					Trait::to_string( m_lex.line_number() ) +
					Trait::from_ascii( "." ) );


			lexeme = m_lex.next_lexeme();
		}

		this->check_parser_state_after_parsing();
	}